

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

void __thiscall Button::setTextTexture(Button *this,Texture *tex)

{
  undefined1 *puVar1;
  Texture *pTVar2;
  
  pTVar2 = (this->m_texture)._M_t.
           super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
           super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl;
  if (pTVar2 != tex) {
    (this->m_texture)._M_t.
    super___uniq_ptr_impl<rengine::Texture,_std::default_delete<rengine::Texture>_>._M_t.
    super__Tuple_impl<0UL,_rengine::Texture_*,_std::default_delete<rengine::Texture>_>.
    super__Head_base<0UL,_rengine::Texture_*,_false>._M_head_impl = tex;
    if (pTVar2 != (Texture *)0x0) {
      (*pTVar2->_vptr_Texture[1])();
    }
    puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
    *puVar1 = *puVar1 | 1;
  }
  return;
}

Assistant:

void Button::setTextTexture(Texture *tex)
{
    if (m_texture.get() == tex)
        return;
    m_texture.reset(tex);
    requestPreprocess();
}